

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

Vec_Ptr_t * Llb_Nonlin4DerivePartitions(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder)

{
  void *pvVar1;
  Vec_Ptr_t *p;
  void *pvVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  DdNode *n;
  Aig_Obj_t *pAVar8;
  int local_5c;
  int i;
  DdNode *bPart;
  DdNode *bBdd1;
  DdNode *bBdd0;
  DdNode *bBdd;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vRoots;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  DdManager *dd_local;
  
  Aig_ManCleanData(pAig);
  pDVar5 = Cudd_ReadOne(dd);
  pAVar6 = Aig_ManConst1(pAig);
  (pAVar6->field_5).pData = pDVar5;
  for (local_5c = 0; iVar3 = Vec_PtrSize(pAig->vCis), local_5c < iVar3; local_5c = local_5c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_5c);
    iVar3 = Llb_ObjBddVar(vOrder,pAVar6);
    pDVar5 = Cudd_bddIthVar(dd,iVar3);
    (pAVar6->field_5).pData = pDVar5;
  }
  for (local_5c = 0; iVar3 = Vec_PtrSize(pAig->vObjs), local_5c < iVar3; local_5c = local_5c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_5c);
    if (((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) &&
       (iVar3 = Llb_ObjBddVar(vOrder,pAVar6), -1 < iVar3)) {
      iVar3 = Llb_ObjBddVar(vOrder,pAVar6);
      pDVar5 = Cudd_bddIthVar(dd,iVar3);
      (pAVar6->field_5).pData = pDVar5;
      Cudd_Ref((DdNode *)(pAVar6->field_5).pData);
    }
  }
  for (local_5c = 0; iVar3 = Saig_ManRegNum(pAig), local_5c < iVar3; local_5c = local_5c + 1) {
    pVVar7 = pAig->vCos;
    iVar3 = Saig_ManPoNum(pAig);
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar7,local_5c + iVar3);
    iVar3 = Llb_ObjBddVar(vOrder,pAVar6);
    pDVar5 = Cudd_bddIthVar(dd,iVar3);
    (pAVar6->field_5).pData = pDVar5;
  }
  pVVar7 = Vec_PtrAlloc(100);
  for (local_5c = 0; iVar3 = Vec_PtrSize(pAig->vObjs), local_5c < iVar3; local_5c = local_5c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_5c);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
      pAVar8 = Aig_ObjFanin0(pAVar6);
      pvVar2 = (pAVar8->field_5).pData;
      iVar3 = Aig_ObjFaninC0(pAVar6);
      pAVar8 = Aig_ObjFanin1(pAVar6);
      pvVar1 = (pAVar8->field_5).pData;
      iVar4 = Aig_ObjFaninC1(pAVar6);
      pDVar5 = Cudd_bddAnd(dd,(DdNode *)((ulong)pvVar2 ^ (long)iVar3),
                           (DdNode *)((ulong)pvVar1 ^ (long)iVar4));
      if (pDVar5 == (DdNode *)0x0) goto LAB_00aa0a14;
      Cudd_Ref(pDVar5);
      if ((pAVar6->field_5).pData == (void *)0x0) {
        (pAVar6->field_5).pData = pDVar5;
      }
      else {
        n = Cudd_bddXnor(dd,(DdNode *)(pAVar6->field_5).pData,pDVar5);
        if (n == (DdNode *)0x0) goto LAB_00aa0a14;
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDVar5);
        Vec_PtrPush(pVVar7,n);
      }
    }
  }
  local_5c = 0;
  while( true ) {
    iVar3 = Saig_ManRegNum(pAig);
    if (iVar3 <= local_5c) {
      for (local_5c = 0; iVar3 = Vec_PtrSize(pAig->vObjs), local_5c < iVar3; local_5c = local_5c + 1
          ) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_5c);
        if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
          Cudd_RecursiveDeref(dd,(DdNode *)(pAVar6->field_5).pData);
        }
      }
      return pVVar7;
    }
    p = pAig->vCos;
    iVar3 = Saig_ManPoNum(pAig);
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p,local_5c + iVar3);
    pAVar8 = Aig_ObjFanin0(pAVar6);
    pvVar2 = (pAVar8->field_5).pData;
    iVar3 = Aig_ObjFaninC0(pAVar6);
    pDVar5 = Cudd_bddXnor(dd,(DdNode *)(pAVar6->field_5).pData,
                          (DdNode *)((ulong)pvVar2 ^ (long)iVar3));
    if (pDVar5 == (DdNode *)0x0) break;
    Cudd_Ref(pDVar5);
    Vec_PtrPush(pVVar7,pDVar5);
    local_5c = local_5c + 1;
  }
LAB_00aa0a14:
  for (local_5c = 0; iVar3 = Vec_PtrSize(pAig->vObjs), local_5c < iVar3; local_5c = local_5c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_5c);
    if (((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) &&
       ((pAVar6->field_5).pData != (void *)0x0)) {
      Cudd_RecursiveDeref(dd,(DdNode *)(pAVar6->field_5).pData);
    }
  }
  for (local_5c = 0; iVar3 = Vec_PtrSize(pVVar7), local_5c < iVar3; local_5c = local_5c + 1) {
    pDVar5 = (DdNode *)Vec_PtrEntry(pVVar7,local_5c);
    Cudd_RecursiveDeref(dd,pDVar5);
  }
  Vec_PtrFree(pVVar7);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4DerivePartitions( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder )
{
    Vec_Ptr_t * vRoots;
    Aig_Obj_t * pObj;
    DdNode * bBdd, * bBdd0, * bBdd1, * bPart;
    int i;
    Aig_ManCleanData( pAig );
    // assign elementary variables
    Aig_ManConst1(pAig)->pData = Cudd_ReadOne(dd); 
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) >= 0 )
        {
            pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
            Cudd_Ref( (DdNode *)pObj->pData );
        }
    Saig_ManForEachLi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // compute intermediate BDDs
    vRoots = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( bBdd == NULL )
            goto finish;
        Cudd_Ref( bBdd );
        if ( pObj->pData == NULL )
        {
            pObj->pData = bBdd;
            continue;
        }
        // create new partition
        bPart = Cudd_bddXnor( dd, (DdNode *)pObj->pData, bBdd );  
        if ( bPart == NULL )
            goto finish;
        Cudd_Ref( bPart );
        Cudd_RecursiveDeref( dd, bBdd );
        Vec_PtrPush( vRoots, bPart );
//printf( "%d ", Cudd_DagSize(bPart) );
    }
    // compute register output BDDs
    Saig_ManForEachLi( pAig, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bPart = Cudd_bddXnor( dd, (DdNode *)pObj->pData, bBdd0 );  
        if ( bPart == NULL )
            goto finish;
        Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
//printf( "%d ", Cudd_DagSize(bPart) );
    }
//printf( "\n" );
    Aig_ManForEachNode( pAig, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    return vRoots;
    // early termination
finish:
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Vec_PtrForEachEntry( DdNode *, vRoots, bPart, i )
        Cudd_RecursiveDeref( dd, bPart );
    Vec_PtrFree( vRoots );
    return NULL;
}